

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O2

bool cppcms::encoding::validate_or_filter
               (string *encoding,char *begin,char *end,string *output,char replace)

{
  char *pcVar1;
  string *this;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  encoding_tester_type p_Var6;
  string tmp_out;
  string utf8_string;
  size_t tmp_count;
  allocator local_c1;
  string *local_c0;
  string local_b8;
  char *local_98;
  long local_90;
  string local_78 [32];
  size_t local_58;
  allocator local_50 [32];
  
  bVar4 = is_utf8((encoding->_M_dataplus)._M_p);
  if (!bVar4) {
    local_c0 = output;
    p_Var6 = impl::validators_set::get((validators_set *)impl::all_validators,encoding);
    if (p_Var6 == (encoding_tester_type)0x0) {
      local_58 = 0;
      bVar4 = valid(encoding,begin,end,&local_58);
      if (!bVar4) {
        std::__cxx11::string::string((string *)&local_b8,"UTF-8",local_50);
        booster::locale::conv::between
                  ((char *)&local_98,begin,(string *)end,(string *)&local_b8,(method_type)encoding);
        this = local_c0;
        std::__cxx11::string::~string((string *)&local_b8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        bVar5 = anon_unknown_16::validate_or_filter_utf8
                          (local_98,local_98 + local_90,&local_b8,'\0');
        if (bVar5) {
          std::__cxx11::string::swap((string *)&local_b8);
        }
        sVar3 = local_b8._M_string_length;
        _Var2._M_p = local_b8._M_dataplus._M_p;
        std::__cxx11::string::string(local_78,"UTF-8",&local_c1);
        booster::locale::conv::between
                  ((char *)local_50,_Var2._M_p,(string *)(_Var2._M_p + sVar3),(string *)encoding,
                   (method_type)local_78);
        std::__cxx11::string::operator=((string *)this,(string *)local_50);
        std::__cxx11::string::~string((string *)local_50);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
    else {
      local_98 = (char *)0x0;
      bVar4 = (*p_Var6)(begin,end,(size_t *)&local_98);
      if (!bVar4) {
        local_c0->_M_string_length = 0;
        *(local_c0->_M_dataplus)._M_p = '\0';
        std::__cxx11::string::reserve((ulong)local_c0);
        while (begin < end) {
          local_b8._M_dataplus._M_p = (pointer)0x0;
          pcVar1 = begin + 1;
          bVar5 = (*p_Var6)(begin,pcVar1,(size_t *)&local_b8);
          begin = pcVar1;
          if ((bVar5) || (replace != '\0')) {
            std::__cxx11::string::push_back((char)local_c0);
          }
        }
      }
    }
    return bVar4;
  }
  bVar4 = anon_unknown_16::validate_or_filter_utf8(begin,end,output,replace);
  return bVar4;
}

Assistant:

bool CPPCMS_API validate_or_filter(	std::string const &encoding,
					char const *begin,char const *end,
					std::string &output,
					char replace)
{
	/// UTF-8 Case
	if(is_utf8(encoding.c_str()))
		return validate_or_filter_utf8(begin,end,output,replace);

	/// 8bit case
	impl::validators_set::encoding_tester_type tester = impl::all_validators.get(encoding);
	if(tester)
		return validate_or_filter_single_byte_charset(tester,begin,end,output,replace);

	size_t tmp_count = 0;
	/// Most common case
	if(valid(encoding,begin,end,tmp_count))
		return true;

	std::string utf8_string = booster::locale::conv::between(
			begin,end,
			"UTF-8",encoding,
			booster::locale::conv::skip);

	std::string tmp_out;

	if(validate_or_filter_utf8(utf8_string.c_str(),utf8_string.c_str() + utf8_string.size(),tmp_out,0)) {
		tmp_out.swap(utf8_string);
	}

	output = booster::locale::conv::between(
			tmp_out.c_str(),
			tmp_out.c_str()+tmp_out.size(),
			encoding,
			"UTF-8",
			booster::locale::conv::skip);
	return false;
}